

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeXMLParser.cpp
# Opt level: O3

void __thiscall xe::xml::Parser::advance(Parser *this)

{
  Token TVar1;
  bool bVar2;
  mapped_type *dst;
  undefined8 extraout_RAX;
  State SVar3;
  long lVar4;
  Parser *pPVar5;
  undefined1 local_50 [32];
  
  if (this->m_element == ELEMENT_START) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::clear(&(this->m_attributes)._M_t);
  }
  if (this->m_state == STATE_YIELD_EMPTY_ELEMENT_END) {
    this->m_element = ELEMENT_END;
    this->m_state = STATE_DATA;
    return;
  }
  if (this->m_element != ELEMENT_INCOMPLETE) {
    Tokenizer::advance(&this->m_tokenizer);
    this->m_element = ELEMENT_INCOMPLETE;
  }
  do {
    TVar1 = (this->m_tokenizer).m_curToken;
    if (TVar1 == TOKEN_COMMENT) goto switchD_0011b360_default;
    if (TVar1 == TOKEN_INCOMPLETE) {
      return;
    }
    switch(this->m_state) {
    case STATE_DATA:
      goto code_r0x0011b377;
    case STATE_ENTITY:
      this->m_state = STATE_DATA;
code_r0x0011b377:
      switch(TVar1) {
      case TOKEN_END_OF_STRING:
        this->m_element = ELEMENT_END_OF_STRING;
        return;
      case TOKEN_DATA:
        this->m_element = ELEMENT_DATA;
        return;
      default:
switchD_0011b37f_caseD_3:
        local_50._0_8_ = local_50 + 0x10;
        pPVar5 = (Parser *)local_50;
        std::__cxx11::string::_M_construct<char_const*>((string *)pPVar5,"Unexpected token","");
        error(pPVar5,(string *)local_50);
LAB_0011b6c7:
        local_50._0_8_ = local_50 + 0x10;
        pPVar5 = (Parser *)local_50;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)pPVar5,"Unexpected token in processing instruction","");
        error(pPVar5,(string *)local_50);
        goto LAB_0011b6f2;
      case TOKEN_TAG_START:
        SVar3 = STATE_START_TAG_OPEN;
        break;
      case TOKEN_END_TAG_START:
        SVar3 = STATE_END_TAG_OPEN;
        break;
      case TOKEN_PROCESSING_INSTRUCTION_START:
        SVar3 = STATE_IN_PROCESSING_INSTRUCTION;
        break;
      case TOKEN_ENTITY:
        this->m_state = STATE_ENTITY;
        this->m_element = ELEMENT_DATA;
        parseEntityValue(this);
        return;
      }
LAB_0011b4f9:
      this->m_state = SVar3;
switchD_0011b360_default:
      Tokenizer::advance(&this->m_tokenizer);
      break;
    case STATE_IN_PROCESSING_INSTRUCTION:
      if (TVar1 - TOKEN_IDENTIFIER < 2) goto switchD_0011b360_default;
      SVar3 = STATE_DATA;
      if (TVar1 == TOKEN_PROCESSING_INSTRUCTION_END) goto LAB_0011b4f9;
      if (TVar1 == TOKEN_EQUAL) goto switchD_0011b360_default;
      goto LAB_0011b6c7;
    case STATE_START_TAG_OPEN:
      if (TVar1 != TOKEN_IDENTIFIER) goto LAB_0011b646;
      std::__cxx11::string::resize
                ((ulong)&this->m_elementName,(char)(this->m_tokenizer).m_curTokenLen);
      SVar3 = STATE_ATTRIBUTE_LIST;
      if (0 < (this->m_tokenizer).m_curTokenLen) {
        lVar4 = 0;
        do {
          (this->m_elementName)._M_dataplus._M_p[lVar4] =
               (this->m_tokenizer).m_buf.m_buffer
               [((this->m_tokenizer).m_buf.m_back + (int)lVar4) % (this->m_tokenizer).m_buf.m_size];
          lVar4 = lVar4 + 1;
        } while (lVar4 < (this->m_tokenizer).m_curTokenLen);
      }
      goto LAB_0011b4f9;
    case STATE_END_TAG_OPEN:
      if (TVar1 == TOKEN_IDENTIFIER) {
        std::__cxx11::string::resize
                  ((ulong)&this->m_elementName,(char)(this->m_tokenizer).m_curTokenLen);
        SVar3 = STATE_EXPECTING_END_TAG_CLOSE;
        if (0 < (this->m_tokenizer).m_curTokenLen) {
          lVar4 = 0;
          do {
            (this->m_elementName)._M_dataplus._M_p[lVar4] =
                 (this->m_tokenizer).m_buf.m_buffer
                 [((this->m_tokenizer).m_buf.m_back + (int)lVar4) % (this->m_tokenizer).m_buf.m_size
                 ];
            lVar4 = lVar4 + 1;
          } while (lVar4 < (this->m_tokenizer).m_curTokenLen);
        }
        goto LAB_0011b4f9;
      }
      goto LAB_0011b5f0;
    case STATE_EXPECTING_END_TAG_CLOSE:
      if (TVar1 == TOKEN_TAG_END) {
        this->m_state = STATE_DATA;
        this->m_element = ELEMENT_END;
        return;
      }
LAB_0011b6f2:
      pPVar5 = (Parser *)local_50;
      local_50._0_8_ = local_50 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)pPVar5,"Expected tag end","");
      error(pPVar5,(string *)local_50);
      if ((undefined1 *)local_50._0_8_ != local_50 + 0x10) {
        operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
      }
      _Unwind_Resume(extraout_RAX);
    case STATE_ATTRIBUTE_LIST:
      if (TVar1 == TOKEN_IDENTIFIER) {
        std::__cxx11::string::resize
                  ((ulong)&this->m_attribName,(char)(this->m_tokenizer).m_curTokenLen);
        SVar3 = STATE_EXPECTING_ATTRIBUTE_EQ;
        if (0 < (this->m_tokenizer).m_curTokenLen) {
          lVar4 = 0;
          do {
            (this->m_attribName)._M_dataplus._M_p[lVar4] =
                 (this->m_tokenizer).m_buf.m_buffer
                 [((this->m_tokenizer).m_buf.m_back + (int)lVar4) % (this->m_tokenizer).m_buf.m_size
                 ];
            lVar4 = lVar4 + 1;
          } while (lVar4 < (this->m_tokenizer).m_curTokenLen);
        }
        goto LAB_0011b4f9;
      }
      if (TVar1 == TOKEN_TAG_END) {
        this->m_state = STATE_DATA;
LAB_0011b54f:
        this->m_element = ELEMENT_START;
        return;
      }
      if (TVar1 == TOKEN_EMPTY_ELEMENT_END) {
        this->m_state = STATE_YIELD_EMPTY_ELEMENT_END;
        goto LAB_0011b54f;
      }
      goto LAB_0011b671;
    case STATE_EXPECTING_ATTRIBUTE_EQ:
      SVar3 = STATE_EXPECTING_ATTRIBUTE_VALUE;
      if (TVar1 == TOKEN_EQUAL) goto LAB_0011b4f9;
      goto LAB_0011b61b;
    case STATE_EXPECTING_ATTRIBUTE_VALUE:
      if (TVar1 == TOKEN_STRING) {
        bVar2 = hasAttribute(this,(this->m_attribName)._M_dataplus._M_p);
        if (!bVar2) {
          dst = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&this->m_attributes,&this->m_attribName);
          Tokenizer::getString(&this->m_tokenizer,dst);
          SVar3 = STATE_ATTRIBUTE_LIST;
          goto LAB_0011b4f9;
        }
      }
      else {
        local_50._0_8_ = local_50 + 0x10;
        pPVar5 = (Parser *)local_50;
        std::__cxx11::string::_M_construct<char_const*>((string *)pPVar5,"Expected value","");
        error(pPVar5,(string *)local_50);
      }
      local_50._0_8_ = local_50 + 0x10;
      pPVar5 = (Parser *)local_50;
      std::__cxx11::string::_M_construct<char_const*>((string *)pPVar5,"Duplicate attribute","");
      error(pPVar5,(string *)local_50);
LAB_0011b5f0:
      local_50._0_8_ = local_50 + 0x10;
      pPVar5 = (Parser *)local_50;
      std::__cxx11::string::_M_construct<char_const*>((string *)pPVar5,"Expected identifier","");
      error(pPVar5,(string *)local_50);
LAB_0011b61b:
      local_50._0_8_ = local_50 + 0x10;
      pPVar5 = (Parser *)local_50;
      std::__cxx11::string::_M_construct<char_const*>((string *)pPVar5,"Expected \'=\'","");
      error(pPVar5,(string *)local_50);
LAB_0011b646:
      local_50._0_8_ = local_50 + 0x10;
      pPVar5 = (Parser *)local_50;
      std::__cxx11::string::_M_construct<char_const*>((string *)pPVar5,"Expected identifier","");
      error(pPVar5,(string *)local_50);
LAB_0011b671:
      local_50._0_8_ = local_50 + 0x10;
      pPVar5 = (Parser *)local_50;
      std::__cxx11::string::_M_construct<char_const*>((string *)pPVar5,"Unexpected token","");
      error(pPVar5,(string *)local_50);
      goto switchD_0011b37f_caseD_3;
    default:
      goto switchD_0011b360_default;
    }
  } while( true );
}

Assistant:

void Parser::advance (void)
{
	if (m_element == ELEMENT_START)
		m_attributes.clear();

	// \note No token is advanced when element end is reported.
	if (m_state == STATE_YIELD_EMPTY_ELEMENT_END)
	{
		DE_ASSERT(m_element == ELEMENT_START);
		m_element	= ELEMENT_END;
		m_state		= STATE_DATA;
		return;
	}

	if (m_element != ELEMENT_INCOMPLETE)
	{
		m_tokenizer.advance();
		m_element = ELEMENT_INCOMPLETE;
	}

	for (;;)
	{
		Token curToken = m_tokenizer.getToken();

		// Skip comments.
		while (curToken == TOKEN_COMMENT)
		{
			m_tokenizer.advance();
			curToken = m_tokenizer.getToken();
		}

		if (curToken == TOKEN_INCOMPLETE)
		{
			DE_ASSERT(m_element == ELEMENT_INCOMPLETE);
			return;
		}

		switch (m_state)
		{
			case STATE_ENTITY:
				m_state = STATE_DATA;
				// Fall-through to STATE_DATA processing.

			case STATE_DATA:
				switch (curToken)
				{
					case TOKEN_DATA:
						m_element = ELEMENT_DATA;
						return;

					case TOKEN_END_OF_STRING:
						m_element = ELEMENT_END_OF_STRING;
						return;

					case TOKEN_TAG_START:
						m_state = STATE_START_TAG_OPEN;
						break;

					case TOKEN_END_TAG_START:
						m_state = STATE_END_TAG_OPEN;
						break;

					case TOKEN_PROCESSING_INSTRUCTION_START:
						m_state = STATE_IN_PROCESSING_INSTRUCTION;
						break;

					case TOKEN_ENTITY:
						m_state		= STATE_ENTITY;
						m_element	= ELEMENT_DATA;
						parseEntityValue();
						return;

					default:
						error("Unexpected token");
				}
				break;

			case STATE_IN_PROCESSING_INSTRUCTION:
				if (curToken == TOKEN_PROCESSING_INSTRUCTION_END)
					m_state = STATE_DATA;
				else
					if (curToken != TOKEN_IDENTIFIER && curToken != TOKEN_EQUAL && curToken != TOKEN_STRING)
						error("Unexpected token in processing instruction");
				break;

			case STATE_START_TAG_OPEN:
				if (curToken != TOKEN_IDENTIFIER)
					error("Expected identifier");
				m_tokenizer.getTokenStr(m_elementName);
				m_state = STATE_ATTRIBUTE_LIST;
				break;

			case STATE_END_TAG_OPEN:
				if (curToken != TOKEN_IDENTIFIER)
					error("Expected identifier");
				m_tokenizer.getTokenStr(m_elementName);
				m_state = STATE_EXPECTING_END_TAG_CLOSE;
				break;

			case STATE_EXPECTING_END_TAG_CLOSE:
				if (curToken != TOKEN_TAG_END)
					error("Expected tag end");
				m_state		= STATE_DATA;
				m_element	= ELEMENT_END;
				return;

			case STATE_ATTRIBUTE_LIST:
				if (curToken == TOKEN_IDENTIFIER)
				{
					m_tokenizer.getTokenStr(m_attribName);
					m_state = STATE_EXPECTING_ATTRIBUTE_EQ;
				}
				else if (curToken == TOKEN_EMPTY_ELEMENT_END)
				{
					m_state		= STATE_YIELD_EMPTY_ELEMENT_END;
					m_element	= ELEMENT_START;
					return;
				}
				else if (curToken == TOKEN_TAG_END)
				{
					m_state		= STATE_DATA;
					m_element	= ELEMENT_START;
					return;
				}
				else
					error("Unexpected token");
				break;

			case STATE_EXPECTING_ATTRIBUTE_EQ:
				if (curToken != TOKEN_EQUAL)
					error("Expected '='");
				m_state = STATE_EXPECTING_ATTRIBUTE_VALUE;
				break;

			case STATE_EXPECTING_ATTRIBUTE_VALUE:
				if (curToken != TOKEN_STRING)
					error("Expected value");
				if (hasAttribute(m_attribName.c_str()))
					error("Duplicate attribute");

				m_tokenizer.getString(m_attributes[m_attribName]);
				m_state = STATE_ATTRIBUTE_LIST;
				break;

			default:
				DE_ASSERT(false);
		}

		m_tokenizer.advance();
	}
}